

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool.cpp
# Opt level: O2

void bool_clause(vec<BoolView> *x,vec<BoolView> *y)

{
  uint i;
  ulong uVar1;
  uint i_1;
  long lVar2;
  Lit local_4c;
  vec<Lit> local_48;
  
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (Lit *)0x0;
  lVar2 = 0xc;
  for (uVar1 = 0; uVar1 < x->sz; uVar1 = uVar1 + 1) {
    local_4c.x = (uint)*(byte *)((long)&(x->data->super_Var).super_Branching._vptr_Branching + lVar2
                                ) + *(int *)((long)x->data + lVar2 + -4) * 2;
    vec<Lit>::push(&local_48,&local_4c);
    lVar2 = lVar2 + 0x10;
  }
  lVar2 = 0xc;
  for (uVar1 = 0; uVar1 < y->sz; uVar1 = uVar1 + 1) {
    local_4c.x = (*(byte *)((long)&(y->data->super_Var).super_Branching._vptr_Branching + lVar2) ^ 1
                 ) + *(int *)((long)y->data + lVar2 + -4) * 2;
    vec<Lit>::push(&local_48,&local_4c);
    lVar2 = lVar2 + 0x10;
  }
  SAT::addClause(&sat,&local_48,false);
  free(local_48.data);
  return;
}

Assistant:

void bool_clause(vec<BoolView>& x, vec<BoolView>& y) {
	vec<Lit> ps;
	for (unsigned int i = 0; i < x.size(); i++) {
		ps.push(x[i]);
	}
	for (unsigned int i = 0; i < y.size(); i++) {
		ps.push(~y[i]);
	}
	sat.addClause(ps);
}